

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool __thiscall RPCHelpMan::IsValidNumArgs(RPCHelpMan *this,size_t num_args)

{
  long lVar1;
  bool bVar2;
  const_reference this_00;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ((long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x108 + 1;
  do {
    if (uVar3 == 1) goto LAB_00aafc90;
    this_00 = std::vector<RPCArg,_std::allocator<RPCArg>_>::at(&this->m_args,uVar3 - 2);
    bVar2 = RPCArg::IsOptional(this_00);
    uVar3 = uVar3 - 1;
  } while (bVar2);
  if (num_args < uVar3) {
    bVar2 = false;
  }
  else {
LAB_00aafc90:
    bVar2 = num_args <=
            (ulong)(((long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool RPCHelpMan::IsValidNumArgs(size_t num_args) const
{
    size_t num_required_args = 0;
    for (size_t n = m_args.size(); n > 0; --n) {
        if (!m_args.at(n - 1).IsOptional()) {
            num_required_args = n;
            break;
        }
    }
    return num_required_args <= num_args && num_args <= m_args.size();
}